

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fits_read_image_speed
              (fitsfile *infptr,float *whole_elapse,float *whole_cpu,float *row_elapse,
              float *row_cpu,int *status)

{
  void *pvVar1;
  float *elapse;
  int iVar2;
  float *in_RCX;
  float *in_RDX;
  float *in_RSI;
  float *in_R8;
  int *in_R9;
  float fVar3;
  double dnull;
  double *darray;
  float filesize;
  float enull;
  float *earray;
  long inc [9];
  long lpixel [9];
  long fpixel [9];
  long naxes [9];
  long ii;
  int *in_stack_00000188;
  int inull;
  int *iarray;
  int anynull;
  int naxis;
  int bitpix;
  short snull;
  short *sarray;
  uchar cnull;
  uchar *carray;
  long *in_stack_fffffffffffffe08;
  int *in_stack_fffffffffffffe10;
  int *piVar4;
  int *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  fitsfile *fptr;
  float *in_stack_fffffffffffffe30;
  undefined1 local_1b8 [64];
  void *in_stack_fffffffffffffe88;
  long *in_stack_fffffffffffffe90;
  long *trc;
  long *blc;
  int in_stack_fffffffffffffeac;
  fitsfile *in_stack_fffffffffffffeb0;
  void *in_stack_fffffffffffffee0;
  int *in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef0;
  long *local_c8;
  long *local_c0;
  long local_78;
  int local_60;
  int local_5c;
  int local_58;
  undefined2 local_52;
  void *local_50;
  undefined1 local_41;
  void *local_40;
  int *local_38;
  float *local_30;
  float *local_28;
  float *local_20;
  float *local_18;
  int local_4;
  
  local_41 = 0;
  local_52 = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  memcpy(&stack0xfffffffffffffee8,&DAT_0026dd40,0x48);
  memcpy(&stack0xfffffffffffffe98,&DAT_0026dd90,0x48);
  memcpy(local_1b8,&DAT_0026dde0,0x48);
  fptr = (fitsfile *)0x0;
  if (*local_38 == 0) {
    ffgipr((fitsfile *)0x0,in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,
           in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(int *)0x10d053);
    if (local_5c == 2) {
      iVar2 = local_58;
      if (local_58 < 1) {
        iVar2 = -local_58;
      }
      fVar3 = (float)(((double)((long)local_c8 * (long)iVar2) / 8000000.0) * (double)(long)local_c0)
      ;
      trc = local_c8;
      blc = local_c0;
      ffpscl(fptr,(double)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (double)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      *local_18 = 0.0;
      *local_20 = 0.0;
      if (local_58 == 8) {
        local_40 = calloc((long)local_c0 * (long)local_c8,1);
        marktime(in_stack_fffffffffffffe10);
        piVar4 = &local_60;
        ffgsv(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,blc,trc,in_stack_fffffffffffffe90,
              in_stack_fffffffffffffe88,in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffef0);
        gettime(in_stack_fffffffffffffe30,(float *)fptr,
                (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        if (local_28 != (float *)0x0) {
          marktime(piVar4);
          for (local_78 = 0; local_78 < (long)local_c0; local_78 = local_78 + 1) {
            ffgpxv((fitsfile *)naxes[7],naxes[6]._4_4_,(long *)naxes[5],naxes[4],(void *)naxes[3],
                   (void *)naxes[2],(int *)ii,in_stack_00000188);
          }
          gettime(in_stack_fffffffffffffe30,(float *)fptr,
                  (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        }
        free(local_40);
      }
      else if (local_58 == 0x10) {
        local_50 = calloc((long)local_c8 * (long)local_c0,2);
        marktime(in_stack_fffffffffffffe10);
        piVar4 = &local_60;
        ffgsv(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,blc,trc,in_stack_fffffffffffffe90,
              in_stack_fffffffffffffe88,in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffef0);
        gettime(in_stack_fffffffffffffe30,(float *)fptr,
                (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        if (local_28 != (float *)0x0) {
          marktime(piVar4);
          for (local_78 = 0; local_78 < (long)local_c0; local_78 = local_78 + 1) {
            ffgpxv((fitsfile *)naxes[7],naxes[6]._4_4_,(long *)naxes[5],naxes[4],(void *)naxes[3],
                   (void *)naxes[2],(int *)ii,in_stack_00000188);
          }
          gettime(in_stack_fffffffffffffe30,(float *)fptr,
                  (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        }
        free(local_50);
      }
      else if (local_58 == 0x20) {
        pvVar1 = calloc((long)local_c8 * (long)local_c0,4);
        marktime(in_stack_fffffffffffffe10);
        piVar4 = &local_60;
        ffgsv(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,blc,trc,in_stack_fffffffffffffe90,
              in_stack_fffffffffffffe88,in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffef0);
        gettime(in_stack_fffffffffffffe30,(float *)fptr,
                (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        if (local_28 != (float *)0x0) {
          marktime(piVar4);
          for (local_78 = 0; local_78 < (long)local_c0; local_78 = local_78 + 1) {
            ffgpxv((fitsfile *)naxes[7],naxes[6]._4_4_,(long *)naxes[5],naxes[4],(void *)naxes[3],
                   (void *)naxes[2],(int *)ii,in_stack_00000188);
          }
          gettime(in_stack_fffffffffffffe30,(float *)fptr,
                  (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        }
        free(pvVar1);
      }
      else if (local_58 == -0x20) {
        pvVar1 = calloc((long)local_c0 * (long)local_c8,4);
        marktime(in_stack_fffffffffffffe10);
        piVar4 = &local_60;
        ffgsv(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,blc,trc,in_stack_fffffffffffffe90,
              in_stack_fffffffffffffe88,in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffef0);
        gettime(in_stack_fffffffffffffe30,(float *)fptr,
                (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        if (local_28 != (float *)0x0) {
          marktime(piVar4);
          for (local_78 = 0; local_78 < (long)local_c0; local_78 = local_78 + 1) {
            ffgpxv((fitsfile *)naxes[7],naxes[6]._4_4_,(long *)naxes[5],naxes[4],(void *)naxes[3],
                   (void *)naxes[2],(int *)ii,in_stack_00000188);
          }
          gettime(in_stack_fffffffffffffe30,(float *)fptr,
                  (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        }
        free(pvVar1);
      }
      else if (local_58 == -0x40) {
        elapse = (float *)calloc((long)local_c0 * (long)local_c8,8);
        marktime(in_stack_fffffffffffffe10);
        piVar4 = &local_60;
        ffgsv(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,blc,trc,in_stack_fffffffffffffe90,
              in_stack_fffffffffffffe88,in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,
              in_stack_fffffffffffffef0);
        gettime(elapse,(float *)fptr,
                (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        if (local_28 != (float *)0x0) {
          marktime(piVar4);
          for (local_78 = 0; local_78 < (long)local_c0; local_78 = local_78 + 1) {
            ffgpxv((fitsfile *)naxes[7],naxes[6]._4_4_,(long *)naxes[5],naxes[4],(void *)naxes[3],
                   (void *)naxes[2],(int *)ii,in_stack_00000188);
          }
          gettime(elapse,(float *)fptr,
                  (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        }
        free(elapse);
      }
      if (local_18 != (float *)0x0) {
        *local_18 = *local_18 / fVar3;
      }
      if (local_28 != (float *)0x0) {
        *local_28 = *local_28 / fVar3;
      }
      if (local_20 != (float *)0x0) {
        *local_20 = *local_20 / fVar3;
      }
      if (local_30 != (float *)0x0) {
        *local_30 = *local_30 / fVar3;
      }
      local_4 = *local_38;
    }
    else {
      local_4 = *local_38;
    }
  }
  else {
    local_4 = *local_38;
  }
  return local_4;
}

Assistant:

int fits_read_image_speed (fitsfile *infptr, float *whole_elapse, 
    float *whole_cpu, float *row_elapse, float *row_cpu, int *status)
{
        unsigned char *carray, cnull = 0;
	short *sarray, snull=0;
	int bitpix, naxis, anynull, *iarray, inull = 0;
	long ii, naxes[9], fpixel[9]={1,1,1,1,1,1,1,1,1}, lpixel[9]={1,1,1,1,1,1,1,1,1};
	long inc[9]={1,1,1,1,1,1,1,1,1} ;
	float *earray, enull = 0, filesize;
	double *darray, dnull = 0;
	
	if (*status) return(*status);

	fits_get_img_param (infptr, 9, &bitpix, &naxis, naxes, status);

	if (naxis != 2)return(*status);
	
	lpixel[0] = naxes[0];
	lpixel[1] = naxes[1];
	
        /* filesize in MB */
	filesize = (float) (naxes[0] * abs(bitpix) / 8000000. * naxes[1]);

	/* measure time required to read the raw image */
	fits_set_bscale(infptr, 1.0, 0.0, status);
	*whole_elapse = 0.;
	*whole_cpu = 0;

        if (bitpix == BYTE_IMG) {
		carray = calloc(naxes[1]*naxes[0], sizeof(char));

                /* remove any cached uncompressed tile 
		  (dangerous to directly modify the structure!) */
         /*       (infptr->Fptr)->tilerow = 0; */

		marktime(status);
		fits_read_subset(infptr, TBYTE, fpixel, lpixel, inc, &cnull, 
		      carray, &anynull, status);
		
		/* get elapsped times */
		gettime(whole_elapse, whole_cpu, status);

		/* now read the image again, row by row */
		if (row_elapse) {

                  /* remove any cached uncompressed tile 
	  	    (dangerous to directly modify the structure!) */
          /*        (infptr->Fptr)->tilerow = 0; */

		  marktime(status);
		  for (ii = 0; ii < naxes[1]; ii++) {
		   fpixel[1] = ii+1;
		   fits_read_pix(infptr, TBYTE, fpixel, naxes[0], &cnull, 
		      carray, &anynull, status);
		   }
		   /* get elapsped times */
		   gettime(row_elapse, row_cpu, status);
		}
 		free(carray);
 
	} else if (bitpix == SHORT_IMG) {
		sarray = calloc(naxes[0]*naxes[1], sizeof(short));

		marktime(status);
		fits_read_subset(infptr, TSHORT, fpixel, lpixel, inc, &snull, 
		      sarray, &anynull, status);

		gettime(whole_elapse, whole_cpu, status);   /* get elapsped times */

		/* now read the image again, row by row */
		if (row_elapse) {
		  marktime(status);
		  for (ii = 0; ii < naxes[1]; ii++) {

		   fpixel[1] = ii+1;
		   fits_read_pix(infptr, TSHORT, fpixel, naxes[0], &snull, 
		      sarray, &anynull, status);
		  }
		  /* get elapsped times */
		  gettime(row_elapse, row_cpu, status);
		}

		free(sarray);	

	} else if (bitpix == LONG_IMG) {
		iarray = calloc(naxes[0]*naxes[1], sizeof(int));

		marktime(status);

		fits_read_subset(infptr, TINT, fpixel, lpixel, inc, &inull, 
		      iarray, &anynull, status);
		
		/* get elapsped times */
		gettime(whole_elapse, whole_cpu, status);


		/* now read the image again, row by row */
		if (row_elapse) {
		  marktime(status);
		  for (ii = 0; ii < naxes[1]; ii++) {
		   fpixel[1] = ii+1;
		   fits_read_pix(infptr, TINT, fpixel, naxes[0], &inull, 
		      iarray, &anynull, status);
		  }
		  /* get elapsped times */
		  gettime(row_elapse, row_cpu, status);
		}


 		free(iarray);	

	} else if (bitpix == FLOAT_IMG)   {
		earray = calloc(naxes[1]*naxes[0], sizeof(float));

		marktime(status);

		fits_read_subset(infptr, TFLOAT, fpixel, lpixel, inc, &enull, 
		      earray, &anynull, status);
		
		/* get elapsped times */
		gettime(whole_elapse, whole_cpu, status);

		/* now read the image again, row by row */
		if (row_elapse) {
		  marktime(status);
		  for (ii = 0; ii < naxes[1]; ii++) {
		   fpixel[1] = ii+1;
		   fits_read_pix(infptr, TFLOAT, fpixel, naxes[0], &enull, 
		      earray, &anynull, status);
		  }
		  /* get elapsped times */
		  gettime(row_elapse, row_cpu, status);
		}

 		free(earray);	

	} else if (bitpix == DOUBLE_IMG)  {
		darray = calloc(naxes[1]*naxes[0], sizeof(double));

		marktime(status);

		fits_read_subset(infptr, TDOUBLE, fpixel, lpixel, inc, &dnull, 
		      darray, &anynull, status);
		
		/* get elapsped times */
		gettime(whole_elapse, whole_cpu, status);

		/* now read the image again, row by row */
		if (row_elapse) {
		  marktime(status);
		  for (ii = 0; ii < naxes[1]; ii++) {
		   fpixel[1] = ii+1;
		   fits_read_pix(infptr, TDOUBLE, fpixel, naxes[0], &dnull, 
		      darray, &anynull, status);
		  }
		  /* get elapsped times */
		  gettime(row_elapse, row_cpu, status);
		}

		free(darray);
	}

        if (whole_elapse) *whole_elapse = *whole_elapse / filesize;
        if (row_elapse)   *row_elapse   = *row_elapse / filesize;
        if (whole_cpu)    *whole_cpu    = *whole_cpu / filesize;
        if (row_cpu)      *row_cpu      = *row_cpu / filesize;

	return(*status);
}